

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_mffsce(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t regno;
  TCGv_i64 ret;
  TCGv_i32 arg3;
  TCGv_i32 mask;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->insns_flags2 & 0x80000) != 0) {
    if (((ctx->fpu_enabled ^ 0xffU) & 1) == 0) {
      ret = tcg_temp_new_i64(tcg_ctx_00);
      gen_reset_fpstatus(tcg_ctx_00);
      tcg_gen_mov_i64_ppc64(tcg_ctx_00,ret,cpu_fpscr);
      regno = rD(ctx->opcode);
      set_fpr(tcg_ctx_00,regno,ret);
      tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret,ret,-0xf9);
      arg3 = tcg_const_i32_ppc64(tcg_ctx_00,3);
      gen_helper_store_fpscr(tcg_ctx_00,tcg_ctx_00->cpu_env,ret,arg3);
      tcg_temp_free_i32(tcg_ctx_00,arg3);
      tcg_temp_free_i64(tcg_ctx_00,ret);
    }
    else {
      gen_exception(ctx,7);
    }
  }
  return;
}

Assistant:

static void gen_mffsce(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0;
    TCGv_i32 mask;

    if (unlikely(!(ctx->insns_flags2 & PPC2_ISA300))) {
        return;
    }

    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }

    t0 = tcg_temp_new_i64(tcg_ctx);

    gen_reset_fpstatus(tcg_ctx);
    tcg_gen_extu_tl_i64(tcg_ctx, t0, cpu_fpscr);
    set_fpr(tcg_ctx, rD(ctx->opcode), t0);

    /* Clear exception enable bits in the FPSCR.  */
    tcg_gen_andi_i64(tcg_ctx, t0, t0, ~FP_ENABLES);
    mask = tcg_const_i32(tcg_ctx, 0x0003);
    gen_helper_store_fpscr(tcg_ctx, tcg_ctx->cpu_env, t0, mask);

    tcg_temp_free_i32(tcg_ctx, mask);
    tcg_temp_free_i64(tcg_ctx, t0);
}